

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall ccs::CcsContext::getBool(CcsContext *this,string *propertyName)

{
  CcsProperty *name;
  uint uVar1;
  int iVar2;
  no_such_property *this_00;
  CcsContext local_30;
  CcsProperty *local_20;
  CcsProperty *prop;
  string *propertyName_local;
  CcsContext *this_local;
  
  prop = (CcsProperty *)propertyName;
  propertyName_local = (string *)this;
  local_20 = getProperty(this,propertyName);
  uVar1 = (*local_20->_vptr_CcsProperty[2])();
  if ((uVar1 & 1) == 0) {
    this_00 = (no_such_property *)__cxa_allocate_exception(0x38);
    name = prop;
    CcsContext(&local_30,this);
    no_such_property::no_such_property(this_00,(string *)name,&local_30);
    __cxa_throw(this_00,&no_such_property::typeinfo,no_such_property::~no_such_property);
  }
  iVar2 = (*local_20->_vptr_CcsProperty[7])();
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool CcsContext::getBool(const std::string &propertyName) const {
  const CcsProperty &prop(getProperty(propertyName));
  if (!prop.exists()) throw no_such_property(propertyName, *this);
  return prop.boolValue();
}